

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,REF_CELL ref_cell)

{
  int iVar1;
  REF_MPI ref_mpi_00;
  bool bVar2;
  REF_STATUS RVar3;
  uint uVar4;
  REF_INT *send_size;
  REF_INT *recv_size;
  void *send;
  void *send_00;
  REF_GLOB *c2n;
  REF_INT *part_00;
  undefined4 *__ptr;
  bool bVar5;
  REF_GLOB local_1f8;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT ref_malloc_init_i_1;
  REF_INT ref_malloc_init_i;
  REF_BOOL need_to_keep;
  REF_INT *b_parts;
  REF_INT *a_parts;
  REF_GLOB *b_c2n;
  REF_GLOB *a_c2n;
  REF_INT *a_next;
  REF_INT i;
  REF_INT cell;
  REF_INT node;
  REF_INT part;
  REF_INT b_total;
  REF_INT a_total;
  REF_INT *b_size;
  REF_INT *a_size;
  REF_INT unique_parts [27];
  REF_INT nunique;
  REF_INT all_parts [27];
  REF_INT nodes [27];
  REF_MPI ref_mpi;
  REF_CELL ref_cell_local;
  REF_NODE ref_node_local;
  
  ref_mpi_00 = ref_node->ref_mpi;
  if (ref_mpi_00->n < 2) {
    ref_node_local._4_4_ = 0;
  }
  else if (ref_mpi_00->n < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",0x5dd
           ,"ref_migrate_shufflin_cell","malloc a_size of REF_INT negative");
    ref_node_local._4_4_ = 1;
  }
  else {
    send_size = (REF_INT *)malloc((long)ref_mpi_00->n << 2);
    if (send_size == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x5dd,"ref_migrate_shufflin_cell","malloc a_size of REF_INT NULL");
      ref_node_local._4_4_ = 2;
    }
    else {
      for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_mpi_00->n;
          ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
        send_size[ref_private_macro_code_rss] = 0;
      }
      if (ref_mpi_00->n < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x5de,"ref_migrate_shufflin_cell","malloc b_size of REF_INT negative");
        ref_node_local._4_4_ = 1;
      }
      else {
        recv_size = (REF_INT *)malloc((long)ref_mpi_00->n << 2);
        if (recv_size == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x5de,"ref_migrate_shufflin_cell","malloc b_size of REF_INT NULL");
          ref_node_local._4_4_ = 2;
        }
        else {
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < ref_mpi_00->n;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            recv_size[ref_private_macro_code_rss_1] = 0;
          }
          for (a_next._4_4_ = 0; a_next._4_4_ < ref_cell->max; a_next._4_4_ = a_next._4_4_ + 1) {
            RVar3 = ref_cell_nodes(ref_cell,a_next._4_4_,all_parts + 0x1a);
            if (RVar3 == 0) {
              for (i = 0; i < ref_cell->node_per; i = i + 1) {
                unique_parts[(long)i + 0x1a] = ref_node->part[all_parts[(long)i + 0x1a]];
              }
              uVar4 = ref_sort_unique_int(ref_cell->node_per,unique_parts + 0x1a,unique_parts + 0x19
                                          ,(REF_INT *)&a_size);
              if (uVar4 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x5e6,"ref_migrate_shufflin_cell",(ulong)uVar4,"unique");
                return uVar4;
              }
              for (i = 0; i < unique_parts[0x19]; i = i + 1) {
                iVar1 = unique_parts[(long)i + -2];
                if (ref_mpi_00->id != iVar1) {
                  send_size[iVar1] = send_size[iVar1] + 1;
                }
              }
            }
          }
          ref_node_local._4_4_ = ref_mpi_alltoall(ref_mpi_00,send_size,recv_size,1);
          if (ref_node_local._4_4_ == 0) {
            part = 0;
            for (cell = 0; cell < ref_mpi_00->n; cell = cell + 1) {
              part = send_size[cell] + part;
            }
            if (ref_cell->size_per * part < 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                     ,0x5f2,"ref_migrate_shufflin_cell","malloc a_c2n of REF_GLOB negative");
              ref_node_local._4_4_ = 1;
            }
            else {
              send = malloc((long)(ref_cell->size_per * part) << 3);
              if (send == (void *)0x0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x5f2,"ref_migrate_shufflin_cell","malloc a_c2n of REF_GLOB NULL");
                ref_node_local._4_4_ = 2;
              }
              else if (ref_cell->size_per * part < 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                       ,0x5f3,"ref_migrate_shufflin_cell","malloc a_parts of REF_INT negative");
                ref_node_local._4_4_ = 1;
              }
              else {
                send_00 = malloc((long)(ref_cell->size_per * part) << 2);
                if (send_00 == (void *)0x0) {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                         ,0x5f3,"ref_migrate_shufflin_cell","malloc a_parts of REF_INT NULL");
                  ref_node_local._4_4_ = 2;
                }
                else {
                  node = 0;
                  for (cell = 0; cell < ref_mpi_00->n; cell = cell + 1) {
                    node = recv_size[cell] + node;
                  }
                  if (ref_cell->size_per * node < 0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                           ,0x5f7,"ref_migrate_shufflin_cell","malloc b_c2n of REF_GLOB negative");
                    ref_node_local._4_4_ = 1;
                  }
                  else {
                    c2n = (REF_GLOB *)malloc((long)(ref_cell->size_per * node) << 3);
                    if (c2n == (REF_GLOB *)0x0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x5f7,"ref_migrate_shufflin_cell","malloc b_c2n of REF_GLOB NULL");
                      ref_node_local._4_4_ = 2;
                    }
                    else if (ref_cell->size_per * node < 0) {
                      printf("%s: %d: %s: %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                             ,0x5f8,"ref_migrate_shufflin_cell","malloc b_parts of REF_INT negative"
                            );
                      ref_node_local._4_4_ = 1;
                    }
                    else {
                      part_00 = (REF_INT *)malloc((long)(ref_cell->size_per * node) << 2);
                      if (part_00 == (REF_INT *)0x0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x5f8,"ref_migrate_shufflin_cell","malloc b_parts of REF_INT NULL");
                        ref_node_local._4_4_ = 2;
                      }
                      else if (ref_mpi_00->n < 0) {
                        printf("%s: %d: %s: %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                               ,0x5fa,"ref_migrate_shufflin_cell",
                               "malloc a_next of REF_INT negative");
                        ref_node_local._4_4_ = 1;
                      }
                      else {
                        __ptr = (undefined4 *)malloc((long)ref_mpi_00->n << 2);
                        if (__ptr == (undefined4 *)0x0) {
                          printf("%s: %d: %s: %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                 ,0x5fa,"ref_migrate_shufflin_cell","malloc a_next of REF_INT NULL")
                          ;
                          ref_node_local._4_4_ = 2;
                        }
                        else {
                          *__ptr = 0;
                          for (cell = 1; cell < ref_mpi_00->n; cell = cell + 1) {
                            __ptr[cell] = __ptr[cell + -1] + send_size[cell + -1];
                          }
                          for (a_next._4_4_ = 0; a_next._4_4_ < ref_cell->max;
                              a_next._4_4_ = a_next._4_4_ + 1) {
                            RVar3 = ref_cell_nodes(ref_cell,a_next._4_4_,all_parts + 0x1a);
                            if (RVar3 == 0) {
                              for (i = 0; i < ref_cell->node_per; i = i + 1) {
                                unique_parts[(long)i + 0x1a] =
                                     ref_node->part[all_parts[(long)i + 0x1a]];
                              }
                              uVar4 = ref_sort_unique_int(ref_cell->node_per,unique_parts + 0x1a,
                                                          unique_parts + 0x19,(REF_INT *)&a_size);
                              if (uVar4 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                       ,0x605,"ref_migrate_shufflin_cell",(ulong)uVar4,"unique");
                                return uVar4;
                              }
                              for (i = 0; i < unique_parts[0x19]; i = i + 1) {
                                iVar1 = unique_parts[(long)i + -2];
                                if (ref_mpi_00->id != iVar1) {
                                  for (a_next._0_4_ = 0; (int)a_next < ref_cell->node_per;
                                      a_next._0_4_ = (int)a_next + 1) {
                                    if (((all_parts[(long)(int)a_next + 0x1a] < 0) ||
                                        (ref_node->max <= all_parts[(long)(int)a_next + 0x1a])) ||
                                       (ref_node->global[all_parts[(long)(int)a_next + 0x1a]] < 0))
                                    {
                                      local_1f8 = -1;
                                    }
                                    else {
                                      local_1f8 = ref_node->global
                                                  [all_parts[(long)(int)a_next + 0x1a]];
                                    }
                                    *(REF_GLOB *)
                                     ((long)send +
                                     (long)((int)a_next + ref_cell->size_per * __ptr[iVar1]) * 8) =
                                         local_1f8;
                                    *(REF_INT *)
                                     ((long)send_00 +
                                     (long)((int)a_next + ref_cell->size_per * __ptr[iVar1]) * 4) =
                                         ref_node->part[all_parts[(long)(int)a_next + 0x1a]];
                                  }
                                  if (ref_cell->last_node_is_an_id != 0) {
                                    *(long *)((long)send +
                                             (long)(ref_cell->node_per +
                                                   ref_cell->size_per * __ptr[iVar1]) * 8) =
                                         (long)all_parts[(long)ref_cell->node_per + 0x1a];
                                    *(undefined4 *)
                                     ((long)send_00 +
                                     (long)(ref_cell->node_per + ref_cell->size_per * __ptr[iVar1])
                                     * 4) = 0xffffffff;
                                  }
                                  __ptr[iVar1] = __ptr[iVar1] + 1;
                                }
                              }
                            }
                          }
                          ref_node_local._4_4_ =
                               ref_mpi_alltoallv(ref_mpi_00,send,send_size,c2n,recv_size,
                                                 ref_cell->size_per,2);
                          if (ref_node_local._4_4_ == 0) {
                            ref_node_local._4_4_ =
                                 ref_mpi_alltoallv(ref_mpi_00,send_00,send_size,part_00,recv_size,
                                                   ref_cell->size_per,1);
                            if (ref_node_local._4_4_ == 0) {
                              ref_node_local._4_4_ =
                                   ref_cell_add_many_global
                                             (ref_cell,ref_node,node,c2n,part_00,ref_mpi_00->id);
                              if (ref_node_local._4_4_ == 0) {
                                free(__ptr);
                                free(part_00);
                                free(c2n);
                                free(send_00);
                                free(send);
                                free(recv_size);
                                free(send_size);
                                for (a_next._4_4_ = 0; a_next._4_4_ < ref_cell->max;
                                    a_next._4_4_ = a_next._4_4_ + 1) {
                                  RVar3 = ref_cell_nodes(ref_cell,a_next._4_4_,all_parts + 0x1a);
                                  if (RVar3 == 0) {
                                    bVar5 = false;
                                    for (i = 0; i < ref_cell->node_per; i = i + 1) {
                                      bVar2 = !bVar5;
                                      bVar5 = true;
                                      if (bVar2) {
                                        bVar5 = ref_mpi_00->id ==
                                                ref_node->part[all_parts[(long)i + 0x1a]];
                                      }
                                    }
                                    if ((!bVar5) &&
                                       (uVar4 = ref_cell_remove(ref_cell,a_next._4_4_), uVar4 != 0))
                                    {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                             ,0x634,"ref_migrate_shufflin_cell",(ulong)uVar4,
                                             "remove");
                                      return uVar4;
                                    }
                                  }
                                }
                                ref_node_local._4_4_ = 0;
                              }
                              else {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                       ,0x624,"ref_migrate_shufflin_cell",
                                       (ulong)ref_node_local._4_4_,"g");
                              }
                            }
                            else {
                              printf("%s: %d: %s: %d %s\n",
                                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                     ,0x620,"ref_migrate_shufflin_cell",(ulong)ref_node_local._4_4_,
                                     "alltoallv parts");
                            }
                          }
                          else {
                            printf("%s: %d: %s: %d %s\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                                   ,0x61d,"ref_migrate_shufflin_cell",(ulong)ref_node_local._4_4_,
                                   "alltoallv c2n");
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                   ,0x5ee,"ref_migrate_shufflin_cell",(ulong)ref_node_local._4_4_,"alltoall sizes");
          }
        }
      }
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_shufflin_cell(REF_NODE ref_node,
                                             REF_CELL ref_cell) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT all_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT nunique;
  REF_INT unique_parts[REF_CELL_MAX_SIZE_PER];
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_INT part, node, cell, i;
  REF_INT *a_next;
  REF_GLOB *a_c2n, *b_c2n;
  REF_INT *a_parts, *b_parts;
  REF_BOOL need_to_keep;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) a_size[part]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) a_total += a_size[part];
  ref_malloc(a_c2n, ref_cell_size_per(ref_cell) * a_total, REF_GLOB);
  ref_malloc(a_parts, ref_cell_size_per(ref_cell) * a_total, REF_INT);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) b_total += b_size[part];
  ref_malloc(b_c2n, ref_cell_size_per(ref_cell) * b_total, REF_GLOB);
  ref_malloc(b_parts, ref_cell_size_per(ref_cell) * b_total, REF_INT);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) a_next[part] =
      a_next[part - 1] + a_size[part - 1];

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      all_parts[node] = ref_node_part(ref_node, nodes[node]);
    }
    RSS(ref_sort_unique_int(ref_cell_node_per(ref_cell), all_parts, &nunique,
                            unique_parts),
        "unique");
    for (node = 0; node < nunique; node++) {
      part = unique_parts[node];
      if (ref_mpi_rank(ref_mpi) != part) {
        for (i = 0; i < ref_cell_node_per(ref_cell); i++) {
          a_c2n[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_global(ref_node, nodes[i]);
          a_parts[i + ref_cell_size_per(ref_cell) * a_next[part]] =
              ref_node_part(ref_node, nodes[i]);
        }
        if (ref_cell_last_node_is_an_id(ref_cell)) {
          a_c2n[ref_cell_node_per(ref_cell) +
                ref_cell_size_per(ref_cell) * a_next[part]] =
              (REF_GLOB)nodes[ref_cell_node_per(ref_cell)];
          a_parts[ref_cell_node_per(ref_cell) +
                  ref_cell_size_per(ref_cell) * a_next[part]] = REF_EMPTY;
        }
        a_next[part]++;
      }
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_c2n, a_size, b_c2n, b_size,
                        ref_cell_size_per(ref_cell), REF_GLOB_TYPE),
      "alltoallv c2n");
  RSS(ref_mpi_alltoallv(ref_mpi, a_parts, a_size, b_parts, b_size,
                        ref_cell_size_per(ref_cell), REF_INT_TYPE),
      "alltoallv parts");

  RSS(ref_cell_add_many_global(ref_cell, ref_node, b_total, b_c2n, b_parts,
                               ref_mpi_rank(ref_mpi)),
      "g");

  free(a_next);
  free(b_parts);
  free(b_c2n);
  free(a_parts);
  free(a_c2n);
  free(b_size);
  free(a_size);

  each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
    need_to_keep = REF_FALSE;
    for (node = 0; node < ref_cell_node_per(ref_cell); node++) {
      need_to_keep = (need_to_keep || (ref_mpi_rank(ref_mpi) ==
                                       ref_node_part(ref_node, nodes[node])));
    }
    if (!need_to_keep) RSS(ref_cell_remove(ref_cell, cell), "remove");
  }

  return REF_SUCCESS;
}